

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRpo.c
# Opt level: O0

int Abc_TruthReadHexDigit(char HexChar)

{
  int local_c;
  char HexChar_local;
  
  if ((HexChar < '0') || ('9' < HexChar)) {
    if ((HexChar < 'A') || ('F' < HexChar)) {
      if ((HexChar < 'a') || ('f' < HexChar)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckyRead.c"
                      ,0x29,"int Abc_TruthReadHexDigit(char)");
      }
      local_c = HexChar + -0x57;
    }
    else {
      local_c = HexChar + -0x37;
    }
  }
  else {
    local_c = HexChar + -0x30;
  }
  return local_c;
}

Assistant:

static inline int Abc_TruthReadHexDigit(char HexChar) {
    if (HexChar >= '0' && HexChar <= '9')
        return HexChar - '0';
    if (HexChar >= 'A' && HexChar <= 'F')
        return HexChar - 'A' + 10;
    if (HexChar >= 'a' && HexChar <= 'f')
        return HexChar - 'a' + 10;
    assert(0); // not a hexadecimal symbol
    return -1; // return value which makes no sense
}